

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                *tokens)

{
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  undefined1 local_58 [8];
  string doubleDash;
  
  std::__cxx11::string::string
            ((string *)local_58,"--",(allocator *)(doubleDash.field_2._M_local_buf + 0xf));
  lVar3 = 0x20;
  for (uVar4 = 1;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar3),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58);
    if (!bVar2) break;
    parseIntoTokens(this,(string *)
                         ((long)&(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar3),tokens);
    lVar3 = lVar3 + 0x20;
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void parseIntoTokens( std::vector<std::string> const& args, std::vector<Token>& tokens ) {
            const std::string doubleDash = "--";
            for( std::size_t i = 1; i < args.size() && args[i] != doubleDash; ++i )
                parseIntoTokens( args[i], tokens);
        }